

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.h
# Opt level: O0

void __thiscall
xlib::Log::
SWrite<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,int,std::__cxx11::string>
          (Log *this,LOG_PRIORITY pri,char *file,uint32_t line,char *function,bool br,string *format
          ,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2,int *args_3,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_4)

{
  char *fmt;
  string local_58 [8];
  string temp;
  bool br_local;
  char *function_local;
  uint32_t line_local;
  char *file_local;
  LOG_PRIORITY pri_local;
  Log *this_local;
  
  std::__cxx11::string::string(local_58,(string *)format);
  Format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,int,std::__cxx11::string>
            (this,(string *)local_58,args,args_1,args_2,args_3,args_4);
  fmt = (char *)std::__cxx11::string::c_str();
  Write(this,pri,file,line,function,br,fmt);
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void SWrite(LOG_PRIORITY pri, const char* file, uint32_t line, const char* function,
        bool br, const std::string& format, const Args&... args) {
        std::string temp(format);
        Format(&temp, args...);
        Write(pri, file, line, function, br, temp.c_str());
    }